

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuildingCode
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  
  bVar1 = HasHasbit(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"if ($get_has_field_bit_from_local$) {\n");
    io::Printer::Indent(printer);
    PrintNestedBuilderCondition
              (this,printer,"result.$name$_ = $name$_;\n",
               "result.$name$_ = $name$Builder_.build();\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,&this->variables_,"  $set_has_field_bit_to_local$;\n}\n");
    return;
  }
  PrintNestedBuilderCondition
            (this,printer,"result.$name$_ = $name$_;\n","result.$name$_ = $name$Builder_.build();\n"
            );
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  if (HasHasbit(descriptor_)) {
    printer->Print(variables_, "if ($get_has_field_bit_from_local$) {\n");
    printer->Indent();
    PrintNestedBuilderCondition(printer, "result.$name$_ = $name$_;\n",
                                "result.$name$_ = $name$Builder_.build();\n");
    printer->Outdent();
    printer->Print(variables_,
                   "  $set_has_field_bit_to_local$;\n"
                   "}\n");
  } else {
    PrintNestedBuilderCondition(printer, "result.$name$_ = $name$_;\n",
                                "result.$name$_ = $name$Builder_.build();\n");
  }
}